

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_sgemm_pack8to16.h
# Opt level: O2

void ncnn::im2col_sgemm_pack8to16_avx512
               (Mat *bottom_im2col,Mat *top_blob,Mat *kernel,Mat *_bias,Option *opt)

{
  undefined4 uVar1;
  undefined1 auVar2 [64];
  uint uVar3;
  uint uVar4;
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [64];
  undefined1 auVar15 [64];
  undefined1 auVar16 [64];
  undefined1 auVar17 [64];
  undefined1 auVar18 [64];
  undefined1 auVar19 [64];
  undefined1 auVar20 [64];
  undefined1 auVar21 [64];
  int *piVar22;
  ulong uVar23;
  long lVar24;
  ulong uVar25;
  undefined1 (*pauVar26) [64];
  uint uVar27;
  long lVar28;
  undefined1 (*pauVar29) [64];
  uint uVar30;
  uint uVar31;
  ulong uVar32;
  undefined1 (*pauVar33) [64];
  undefined1 (*pauVar34) [32];
  int q;
  ulong uVar35;
  int iVar36;
  undefined1 (*pauVar37) [32];
  long lVar39;
  ulong uVar40;
  bool bVar41;
  undefined1 auVar42 [64];
  undefined1 auVar43 [64];
  undefined1 auVar44 [64];
  undefined1 auVar45 [64];
  undefined1 auVar46 [64];
  undefined1 auVar47 [64];
  undefined1 auVar48 [64];
  undefined1 auVar49 [64];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  Mat local_d8;
  ulong local_90;
  ulong local_88;
  void *local_80;
  float zeros [16];
  ulong uVar38;
  
  uVar3 = bottom_im2col->w;
  uVar40 = (ulong)(int)uVar3;
  uVar4 = bottom_im2col->h;
  uVar31 = bottom_im2col->c;
  local_88 = (ulong)(uint)top_blob->c;
  local_80 = _bias->data;
  local_d8.cstep = 0;
  local_d8.data = (void *)0x0;
  local_d8.refcount._0_4_ = 0;
  local_d8.refcount._4_4_ = 0;
  local_d8.elemsize._0_4_ = 0;
  local_d8.elemsize._4_4_ = 0;
  local_d8.elempack = 0;
  local_d8.allocator = (Allocator *)0x0;
  local_d8.dims = 0;
  uVar27 = uVar4 * 8;
  if ((long)uVar40 < 8) {
    uVar27 = uVar4;
  }
  local_d8.w = 0;
  local_d8.h = 0;
  local_d8.d = 0;
  local_d8.c = 0;
  uVar30 = (uVar3 & 7) + (uVar3 >> 3);
  if ((long)uVar40 < 8) {
    uVar30 = uVar3;
  }
  Mat::create(&local_d8,uVar27,uVar31,uVar30,0x20,8,opt->workspace_allocator);
  uVar23 = 0;
  uVar27 = 0;
  if (0 < (int)uVar4) {
    uVar27 = uVar4;
  }
  uVar32 = 0;
  if (0 < (int)uVar31) {
    uVar32 = (ulong)uVar31;
  }
  uVar25 = (ulong)(uint)((int)uVar3 >> 3);
  if ((int)uVar3 >> 3 < 1) {
    uVar25 = uVar23;
  }
  lVar28 = (long)(int)(uVar3 * 8) * 4;
  lVar24 = 0x80;
  for (; uVar23 != uVar25; uVar23 = uVar23 + 1) {
    pauVar34 = (undefined1 (*) [32])
               (local_d8.cstep * uVar23 *
                CONCAT44(local_d8.elemsize._4_4_,(undefined4)local_d8.elemsize) +
               (long)local_d8.data);
    for (uVar35 = 0; uVar35 != uVar32; uVar35 = uVar35 + 1) {
      pauVar37 = (undefined1 (*) [32])
                 ((long)bottom_im2col->data +
                 bottom_im2col->cstep * bottom_im2col->elemsize * uVar35 + lVar24);
      uVar30 = uVar27;
      while (bVar41 = uVar30 != 0, uVar30 = uVar30 - 1, bVar41) {
        auVar11 = vunpcklps_avx(pauVar37[-4],pauVar37[-3]);
        auVar5 = vunpckhps_avx(pauVar37[-4],pauVar37[-3]);
        auVar12 = vunpcklps_avx(pauVar37[-2],pauVar37[-1]);
        auVar6 = vunpckhps_avx(pauVar37[-2],pauVar37[-1]);
        auVar13 = vunpcklps_avx(*pauVar37,pauVar37[1]);
        auVar7 = vunpckhps_avx(*pauVar37,pauVar37[1]);
        auVar50 = vunpcklps_avx(pauVar37[2],pauVar37[3]);
        auVar8 = vunpckhps_avx(pauVar37[2],pauVar37[3]);
        auVar9 = vunpcklpd_avx(auVar11,auVar12);
        auVar11 = vunpckhpd_avx(auVar11,auVar12);
        auVar12 = vunpcklpd_avx(auVar5,auVar6);
        auVar5 = vunpckhpd_avx(auVar5,auVar6);
        auVar10 = vunpcklpd_avx(auVar13,auVar50);
        auVar6 = vunpckhpd_avx(auVar13,auVar50);
        auVar13 = vunpcklpd_avx(auVar7,auVar8);
        auVar7 = vunpckhpd_avx(auVar7,auVar8);
        auVar50._16_16_ = auVar10._0_16_;
        auVar50._0_16_ = auVar9._0_16_;
        auVar51._16_16_ = auVar6._0_16_;
        auVar51._0_16_ = auVar11._0_16_;
        auVar52._16_16_ = auVar13._0_16_;
        auVar52._0_16_ = auVar12._0_16_;
        auVar53._16_16_ = auVar7._0_16_;
        auVar53._0_16_ = auVar5._0_16_;
        auVar8 = vperm2f128_avx(auVar9,auVar10,0x31);
        auVar11 = vperm2f128_avx(auVar11,auVar6,0x31);
        auVar6 = vperm2f128_avx(auVar12,auVar13,0x31);
        auVar5 = vperm2f128_avx(auVar5,auVar7,0x31);
        *pauVar34 = auVar50;
        pauVar34[1] = auVar51;
        pauVar34[2] = auVar52;
        pauVar34[3] = auVar53;
        pauVar34[4] = auVar8;
        pauVar34[5] = auVar11;
        pauVar34[6] = auVar6;
        pauVar34[7] = auVar5;
        pauVar34 = pauVar34 + 8;
        pauVar37 = (undefined1 (*) [32])(*pauVar37 + lVar28);
      }
    }
    lVar24 = lVar24 + 0x100;
  }
  uVar23 = uVar40 & 0xfffffffffffffff8;
  lVar24 = uVar23 << 5;
  for (; (long)uVar23 < (long)uVar40; uVar23 = uVar23 + 1) {
    uVar25 = (ulong)(uint)((int)uVar23 >> 0x1f) << 0x20 | uVar23 & 0xffffffff;
    pauVar34 = (undefined1 (*) [32])
               ((long)((int)((long)uVar25 % 8) + (int)((long)uVar25 / 8)) * local_d8.cstep *
                CONCAT44(local_d8.elemsize._4_4_,(undefined4)local_d8.elemsize) +
               (long)local_d8.data);
    for (uVar25 = 0; uVar25 != uVar32; uVar25 = uVar25 + 1) {
      pauVar37 = (undefined1 (*) [32])
                 ((long)bottom_im2col->data +
                 bottom_im2col->cstep * bottom_im2col->elemsize * uVar25 + lVar24);
      uVar30 = uVar27;
      while (bVar41 = uVar30 != 0, uVar30 = uVar30 - 1, bVar41) {
        *pauVar34 = *pauVar37;
        pauVar34 = pauVar34 + 1;
        pauVar37 = (undefined1 (*) [32])(*pauVar37 + lVar28);
      }
    }
    lVar24 = lVar24 + 0x20;
  }
  uVar32 = 0;
  uVar23 = (ulong)(uVar31 * uVar4 * 8);
  if ((int)(uVar31 * uVar4 * 8) < 1) {
    uVar23 = uVar32;
  }
  uVar25 = local_88 & 0xffffffff;
  if ((int)local_88 < 1) {
    uVar25 = uVar32;
  }
  for (; uVar32 != uVar25; uVar32 = uVar32 + 1) {
    pauVar26 = (undefined1 (*) [64])
               (top_blob->cstep * uVar32 * top_blob->elemsize + (long)top_blob->data);
    zeros[0] = 0.0;
    zeros[1] = 0.0;
    zeros[2] = 0.0;
    zeros[3] = 0.0;
    zeros[4] = 0.0;
    zeros[5] = 0.0;
    zeros[6] = 0.0;
    zeros[7] = 0.0;
    zeros[8] = 0.0;
    zeros[9] = 0.0;
    zeros[10] = 0.0;
    zeros[0xb] = 0.0;
    zeros[0xc] = 0.0;
    zeros[0xd] = 0.0;
    zeros[0xe] = 0.0;
    zeros[0xf] = 0.0;
    pauVar29 = (undefined1 (*) [64])(uVar32 * 0x40 + (long)local_80);
    if (local_80 == (void *)0x0) {
      pauVar29 = (undefined1 (*) [64])zeros;
    }
    lVar24 = 0;
    for (uVar35 = 0; (long)(uVar35 | 7) < (long)uVar40; uVar35 = uVar35 + 8) {
      lVar28 = local_d8.cstep * CONCAT44(local_d8.elemsize._4_4_,(undefined4)local_d8.elemsize) *
               lVar24;
      auVar42 = *pauVar29;
      lVar39 = 0;
      uVar38 = uVar23;
      auVar43 = auVar42;
      auVar44 = auVar42;
      auVar45 = auVar42;
      auVar46 = auVar42;
      auVar47 = auVar42;
      auVar48 = auVar42;
      auVar49 = auVar42;
      while (iVar36 = (int)uVar38, uVar38 = (ulong)(iVar36 - 1), iVar36 != 0) {
        auVar2 = *(undefined1 (*) [64])
                  ((long)kernel->data + lVar39 * 2 + kernel->cstep * uVar32 * kernel->elemsize);
        uVar1 = *(undefined4 *)((long)local_d8.data + lVar39 + lVar28);
        auVar14._4_4_ = uVar1;
        auVar14._0_4_ = uVar1;
        auVar14._8_4_ = uVar1;
        auVar14._12_4_ = uVar1;
        auVar14._16_4_ = uVar1;
        auVar14._20_4_ = uVar1;
        auVar14._24_4_ = uVar1;
        auVar14._28_4_ = uVar1;
        auVar14._32_4_ = uVar1;
        auVar14._36_4_ = uVar1;
        auVar14._40_4_ = uVar1;
        auVar14._44_4_ = uVar1;
        auVar14._48_4_ = uVar1;
        auVar14._52_4_ = uVar1;
        auVar14._56_4_ = uVar1;
        auVar14._60_4_ = uVar1;
        auVar42 = vfmadd231ps_avx512f(auVar42,auVar2,auVar14);
        uVar1 = *(undefined4 *)((long)local_d8.data + lVar39 + lVar28 + 4);
        auVar15._4_4_ = uVar1;
        auVar15._0_4_ = uVar1;
        auVar15._8_4_ = uVar1;
        auVar15._12_4_ = uVar1;
        auVar15._16_4_ = uVar1;
        auVar15._20_4_ = uVar1;
        auVar15._24_4_ = uVar1;
        auVar15._28_4_ = uVar1;
        auVar15._32_4_ = uVar1;
        auVar15._36_4_ = uVar1;
        auVar15._40_4_ = uVar1;
        auVar15._44_4_ = uVar1;
        auVar15._48_4_ = uVar1;
        auVar15._52_4_ = uVar1;
        auVar15._56_4_ = uVar1;
        auVar15._60_4_ = uVar1;
        auVar43 = vfmadd231ps_avx512f(auVar43,auVar2,auVar15);
        uVar1 = *(undefined4 *)((long)local_d8.data + lVar39 + lVar28 + 8);
        auVar16._4_4_ = uVar1;
        auVar16._0_4_ = uVar1;
        auVar16._8_4_ = uVar1;
        auVar16._12_4_ = uVar1;
        auVar16._16_4_ = uVar1;
        auVar16._20_4_ = uVar1;
        auVar16._24_4_ = uVar1;
        auVar16._28_4_ = uVar1;
        auVar16._32_4_ = uVar1;
        auVar16._36_4_ = uVar1;
        auVar16._40_4_ = uVar1;
        auVar16._44_4_ = uVar1;
        auVar16._48_4_ = uVar1;
        auVar16._52_4_ = uVar1;
        auVar16._56_4_ = uVar1;
        auVar16._60_4_ = uVar1;
        auVar44 = vfmadd231ps_avx512f(auVar44,auVar2,auVar16);
        uVar1 = *(undefined4 *)((long)local_d8.data + lVar39 + lVar28 + 0xc);
        auVar17._4_4_ = uVar1;
        auVar17._0_4_ = uVar1;
        auVar17._8_4_ = uVar1;
        auVar17._12_4_ = uVar1;
        auVar17._16_4_ = uVar1;
        auVar17._20_4_ = uVar1;
        auVar17._24_4_ = uVar1;
        auVar17._28_4_ = uVar1;
        auVar17._32_4_ = uVar1;
        auVar17._36_4_ = uVar1;
        auVar17._40_4_ = uVar1;
        auVar17._44_4_ = uVar1;
        auVar17._48_4_ = uVar1;
        auVar17._52_4_ = uVar1;
        auVar17._56_4_ = uVar1;
        auVar17._60_4_ = uVar1;
        auVar45 = vfmadd231ps_avx512f(auVar45,auVar2,auVar17);
        uVar1 = *(undefined4 *)((long)local_d8.data + lVar39 + lVar28 + 0x10);
        auVar18._4_4_ = uVar1;
        auVar18._0_4_ = uVar1;
        auVar18._8_4_ = uVar1;
        auVar18._12_4_ = uVar1;
        auVar18._16_4_ = uVar1;
        auVar18._20_4_ = uVar1;
        auVar18._24_4_ = uVar1;
        auVar18._28_4_ = uVar1;
        auVar18._32_4_ = uVar1;
        auVar18._36_4_ = uVar1;
        auVar18._40_4_ = uVar1;
        auVar18._44_4_ = uVar1;
        auVar18._48_4_ = uVar1;
        auVar18._52_4_ = uVar1;
        auVar18._56_4_ = uVar1;
        auVar18._60_4_ = uVar1;
        auVar46 = vfmadd231ps_avx512f(auVar46,auVar2,auVar18);
        uVar1 = *(undefined4 *)((long)local_d8.data + lVar39 + lVar28 + 0x14);
        auVar19._4_4_ = uVar1;
        auVar19._0_4_ = uVar1;
        auVar19._8_4_ = uVar1;
        auVar19._12_4_ = uVar1;
        auVar19._16_4_ = uVar1;
        auVar19._20_4_ = uVar1;
        auVar19._24_4_ = uVar1;
        auVar19._28_4_ = uVar1;
        auVar19._32_4_ = uVar1;
        auVar19._36_4_ = uVar1;
        auVar19._40_4_ = uVar1;
        auVar19._44_4_ = uVar1;
        auVar19._48_4_ = uVar1;
        auVar19._52_4_ = uVar1;
        auVar19._56_4_ = uVar1;
        auVar19._60_4_ = uVar1;
        auVar47 = vfmadd231ps_avx512f(auVar47,auVar2,auVar19);
        uVar1 = *(undefined4 *)((long)local_d8.data + lVar39 + lVar28 + 0x18);
        auVar20._4_4_ = uVar1;
        auVar20._0_4_ = uVar1;
        auVar20._8_4_ = uVar1;
        auVar20._12_4_ = uVar1;
        auVar20._16_4_ = uVar1;
        auVar20._20_4_ = uVar1;
        auVar20._24_4_ = uVar1;
        auVar20._28_4_ = uVar1;
        auVar20._32_4_ = uVar1;
        auVar20._36_4_ = uVar1;
        auVar20._40_4_ = uVar1;
        auVar20._44_4_ = uVar1;
        auVar20._48_4_ = uVar1;
        auVar20._52_4_ = uVar1;
        auVar20._56_4_ = uVar1;
        auVar20._60_4_ = uVar1;
        auVar48 = vfmadd231ps_avx512f(auVar48,auVar2,auVar20);
        uVar1 = *(undefined4 *)((long)local_d8.data + lVar39 + lVar28 + 0x1c);
        auVar21._4_4_ = uVar1;
        auVar21._0_4_ = uVar1;
        auVar21._8_4_ = uVar1;
        auVar21._12_4_ = uVar1;
        auVar21._16_4_ = uVar1;
        auVar21._20_4_ = uVar1;
        auVar21._24_4_ = uVar1;
        auVar21._28_4_ = uVar1;
        auVar21._32_4_ = uVar1;
        auVar21._36_4_ = uVar1;
        auVar21._40_4_ = uVar1;
        auVar21._44_4_ = uVar1;
        auVar21._48_4_ = uVar1;
        auVar21._52_4_ = uVar1;
        auVar21._56_4_ = uVar1;
        auVar21._60_4_ = uVar1;
        auVar49 = vfmadd231ps_avx512f(auVar49,auVar2,auVar21);
        lVar39 = lVar39 + 0x20;
      }
      *pauVar26 = auVar42;
      pauVar26[1] = auVar43;
      pauVar26[2] = auVar44;
      pauVar26[3] = auVar45;
      pauVar26[4] = auVar46;
      pauVar26[5] = auVar47;
      pauVar26[6] = auVar48;
      pauVar26[7] = auVar49;
      pauVar26 = pauVar26 + 8;
      lVar24 = lVar24 + 1;
    }
    while (uVar31 = (uint)uVar35, (int)uVar31 < (int)uVar3) {
      pauVar33 = (undefined1 (*) [64])
                 (kernel->cstep * uVar32 * kernel->elemsize + (long)kernel->data);
      auVar42 = *pauVar29;
      for (lVar24 = 0; (int)uVar23 != (int)lVar24; lVar24 = lVar24 + 1) {
        auVar43 = vbroadcastss_avx512f
                            (ZEXT416(*(uint *)((long)local_d8.data +
                                              lVar24 * 4 +
                                              local_d8.cstep *
                                              CONCAT44(local_d8.elemsize._4_4_,
                                                       (undefined4)local_d8.elemsize) *
                                              (ulong)((uVar31 & 7) +
                                                     ((uint)(uVar35 >> 3) & 0x1fffffff)))));
        auVar42 = vfmadd231ps_avx512f(auVar42,auVar43,*pauVar33);
        pauVar33 = pauVar33 + 1;
      }
      *pauVar26 = auVar42;
      pauVar26 = pauVar26 + 1;
      uVar35 = (ulong)(uVar31 + 1);
    }
  }
  piVar22 = (int *)CONCAT44(local_d8.refcount._4_4_,local_d8.refcount._0_4_);
  if (piVar22 != (int *)0x0) {
    LOCK();
    *piVar22 = *piVar22 + -1;
    UNLOCK();
    if (*piVar22 == 0) {
      local_90 = (ulong)uVar4;
      if (local_d8.allocator == (Allocator *)0x0) {
        free(local_d8.data);
      }
      else {
        (*(local_d8.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  return;
}

Assistant:

static void im2col_sgemm_pack8to16_avx512(const Mat& bottom_im2col, Mat& top_blob, const Mat& kernel, const Mat& _bias, const Option& opt)
{
    // Mat bottom_im2col(size, maxk, inch, 32u, 8, opt.workspace_allocator);

    const int size = bottom_im2col.w;
    const int maxk = bottom_im2col.h;
    const int inch = bottom_im2col.c;

    const int outch = top_blob.c;

    const float* bias = _bias;

    // permute
    Mat tmp;
    if (size >= 8)
        tmp.create(8 * maxk, inch, size / 8 + size % 8, 32u, 8, opt.workspace_allocator);
    else
        tmp.create(maxk, inch, size, 32u, 8, opt.workspace_allocator);
    {
        int nn_size = size >> 3;
        int remain_size_start = 0;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int ii = 0; ii < nn_size; ii++)
        {
            int i = remain_size_start + ii * 8;

            float* tmpptr = tmp.channel(i / 8);

            for (int q = 0; q < inch; q++)
            {
                const float* img0 = (const float*)bottom_im2col.channel(q) + i * 8;

                for (int k = 0; k < maxk; k++)
                {
                    // transpose 8x8
                    __m256 _r0 = _mm256_load_ps(img0);
                    __m256 _r1 = _mm256_load_ps(img0 + 8);
                    __m256 _r2 = _mm256_load_ps(img0 + 8 * 2);
                    __m256 _r3 = _mm256_load_ps(img0 + 8 * 3);
                    __m256 _r4 = _mm256_load_ps(img0 + 8 * 4);
                    __m256 _r5 = _mm256_load_ps(img0 + 8 * 5);
                    __m256 _r6 = _mm256_load_ps(img0 + 8 * 6);
                    __m256 _r7 = _mm256_load_ps(img0 + 8 * 7);

                    transpose8_ps(_r0, _r1, _r2, _r3, _r4, _r5, _r6, _r7);

                    _mm256_store_ps(tmpptr, _r0);
                    _mm256_store_ps(tmpptr + 8, _r1);
                    _mm256_store_ps(tmpptr + 8 * 2, _r2);
                    _mm256_store_ps(tmpptr + 8 * 3, _r3);
                    _mm256_store_ps(tmpptr + 8 * 4, _r4);
                    _mm256_store_ps(tmpptr + 8 * 5, _r5);
                    _mm256_store_ps(tmpptr + 8 * 6, _r6);
                    _mm256_store_ps(tmpptr + 8 * 7, _r7);

                    img0 += size * 8;
                    tmpptr += 64;
                }
            }
        }

        remain_size_start += nn_size << 3;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int i = remain_size_start; i < size; i++)
        {
            float* tmpptr = tmp.channel(i / 8 + i % 8);

            for (int q = 0; q < inch; q++)
            {
                const float* img0 = (const float*)bottom_im2col.channel(q) + i * 8;

                for (int k = 0; k < maxk; k++)
                {
                    __m256 _val = _mm256_load_ps(img0);
                    _mm256_store_ps(tmpptr, _val);

                    img0 += size * 8;
                    tmpptr += 8;
                }
            }
        }
    }

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int p = 0; p < outch; p++)
    {
        float* outptr0 = top_blob.channel(p);

        const float zeros[16] = {0.f, 0.f, 0.f, 0.f, 0.f, 0.f, 0.f, 0.f, 0.f, 0.f, 0.f, 0.f, 0.f, 0.f, 0.f, 0.f};
        const float* biasptr = bias ? bias + p * 16 : zeros;

        int i = 0;
        for (; i + 7 < size; i += 8)
        {
            float* tmpptr = tmp.channel(i / 8);
            const float* kptr = kernel.channel(p);

            int nn = inch * maxk * 8; // inch always > 0

            __m512 _sum0 = _mm512_loadu_ps(biasptr);
            __m512 _sum1 = _sum0;
            __m512 _sum2 = _sum0;
            __m512 _sum3 = _sum0;
            __m512 _sum4 = _sum0;
            __m512 _sum5 = _sum0;
            __m512 _sum6 = _sum0;
            __m512 _sum7 = _sum0;

            for (int j = 0; j < nn; j++)
            {
                __m512 _w0 = _mm512_load_ps(kptr);

                __m512 _val0 = _mm512_set1_ps(tmpptr[0]);
                __m512 _val1 = _mm512_set1_ps(tmpptr[1]);
                __m512 _val2 = _mm512_set1_ps(tmpptr[2]);
                __m512 _val3 = _mm512_set1_ps(tmpptr[3]);
                __m512 _val4 = _mm512_set1_ps(tmpptr[4]);
                __m512 _val5 = _mm512_set1_ps(tmpptr[5]);
                __m512 _val6 = _mm512_set1_ps(tmpptr[6]);
                __m512 _val7 = _mm512_set1_ps(tmpptr[7]);

                _sum0 = _mm512_fmadd_ps(_val0, _w0, _sum0);
                _sum1 = _mm512_fmadd_ps(_val1, _w0, _sum1);
                _sum2 = _mm512_fmadd_ps(_val2, _w0, _sum2);
                _sum3 = _mm512_fmadd_ps(_val3, _w0, _sum3);
                _sum4 = _mm512_fmadd_ps(_val4, _w0, _sum4);
                _sum5 = _mm512_fmadd_ps(_val5, _w0, _sum5);
                _sum6 = _mm512_fmadd_ps(_val6, _w0, _sum6);
                _sum7 = _mm512_fmadd_ps(_val7, _w0, _sum7);

                kptr += 16;
                tmpptr += 8;
            }

            _mm512_store_ps(outptr0, _sum0);
            _mm512_store_ps(outptr0 + 16, _sum1);
            _mm512_store_ps(outptr0 + 16 * 2, _sum2);
            _mm512_store_ps(outptr0 + 16 * 3, _sum3);
            _mm512_store_ps(outptr0 + 16 * 4, _sum4);
            _mm512_store_ps(outptr0 + 16 * 5, _sum5);
            _mm512_store_ps(outptr0 + 16 * 6, _sum6);
            _mm512_store_ps(outptr0 + 16 * 7, _sum7);

            outptr0 += 16 * 8;
        }
        for (; i < size; i++)
        {
            float* tmpptr = tmp.channel(i / 8 + i % 8);
            const float* kptr = kernel.channel(p);

            int nn = inch * maxk * 8; // inch always > 0

            __m512 _sum0 = _mm512_loadu_ps(biasptr);

            for (int j = 0; j < nn; j++)
            {
                __m512 _w0 = _mm512_load_ps(kptr);
                __m512 _val0 = _mm512_set1_ps(tmpptr[0]);
                _sum0 = _mm512_fmadd_ps(_val0, _w0, _sum0);

                kptr += 16;
                tmpptr += 1;
            }

            _mm512_store_ps(outptr0, _sum0);
            outptr0 += 16;
        }
    }
}